

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_key(ImGuiInputTextState *str,STB_TexteditState *state,int key)

{
  bool bVar1;
  ImWchar IVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  float fVar6;
  int local_f4;
  float local_f0;
  int local_ec;
  float local_e8;
  int local_e4;
  int n_2;
  int n_1;
  int n;
  float dx_1;
  float goal_x_1;
  float x_1;
  int row_count_1;
  int is_page_1;
  int sel_1;
  int prev_scan;
  int j_1;
  int i_1;
  StbTexteditRow row_1;
  StbFindState find_1;
  float dx;
  int start;
  float goal_x;
  float x;
  int row_count;
  int is_page;
  int sel;
  int j;
  int i;
  StbTexteditRow row;
  StbFindState find;
  uint uStack_1c;
  ImWchar ch;
  int c;
  int key_local;
  STB_TexteditState *state_local;
  ImGuiInputTextState *str_local;
  
  uStack_1c = key;
LAB_0018bbb6:
  do {
    if (uStack_1c == 0x200000) {
      if (state->select_start == state->select_end) {
        if (0 < state->cursor) {
          state->cursor = state->cursor + -1;
        }
      }
      else {
        stb_textedit_move_to_first(state);
      }
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x200001) {
      if (state->select_start == state->select_end) {
        state->cursor = state->cursor + 1;
      }
      else {
        stb_textedit_move_to_last(str,state);
      }
      stb_textedit_clamp(str,state);
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x200002) goto LAB_0018c3cb;
    if (uStack_1c == 0x200003) goto LAB_0018c189;
    if (uStack_1c == 0x200004) {
      stb_textedit_clamp(str,state);
      stb_textedit_move_to_first(state);
      if (state->single_line == '\0') {
        while( true ) {
          bVar1 = false;
          if (0 < state->cursor) {
            IVar2 = STB_TEXTEDIT_GETCHAR(str,state->cursor + -1);
            bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
          }
          if (!bVar1) break;
          state->cursor = state->cursor + -1;
        }
      }
      else {
        state->cursor = 0;
      }
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x200005) {
      iVar4 = STB_TEXTEDIT_STRINGLEN(str);
      stb_textedit_clamp(str,state);
      stb_textedit_move_to_first(state);
      if (state->single_line == '\0') {
        while( true ) {
          bVar1 = false;
          if (state->cursor < iVar4) {
            IVar2 = STB_TEXTEDIT_GETCHAR(str,state->cursor);
            bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
          }
          if (!bVar1) break;
          state->cursor = state->cursor + 1;
        }
      }
      else {
        state->cursor = iVar4;
      }
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x200006) {
      state->select_end = 0;
      state->select_start = 0;
      state->cursor = 0;
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x200007) {
      iVar4 = STB_TEXTEDIT_STRINGLEN(str);
      state->cursor = iVar4;
      state->select_end = 0;
      state->select_start = 0;
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x200008) {
LAB_0018c6bf:
      if (state->select_start == state->select_end) {
        iVar4 = STB_TEXTEDIT_STRINGLEN(str);
        if (state->cursor < iVar4) {
          stb_textedit_delete(str,state,state->cursor,1);
        }
      }
      else {
        stb_textedit_delete_selection(str,state);
      }
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x200009) {
LAB_0018c722:
      if (state->select_start == state->select_end) {
        stb_textedit_clamp(str,state);
        if (0 < state->cursor) {
          stb_textedit_delete(str,state,state->cursor + -1,1);
          state->cursor = state->cursor + -1;
        }
      }
      else {
        stb_textedit_delete_selection(str,state);
      }
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x20000a) {
      stb_text_undo(str,state);
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x20000b) {
      stb_text_redo(str,state);
      state->has_preferred_x = '\0';
      return;
    }
    if (uStack_1c == 0x20000c) {
      if (state->select_start != state->select_end) {
        stb_textedit_move_to_first(state);
        return;
      }
      iVar4 = STB_TEXTEDIT_MOVEWORDLEFT_IMPL(str,state->cursor);
      state->cursor = iVar4;
      stb_textedit_clamp(str,state);
      return;
    }
    if (uStack_1c == 0x20000d) {
      if (state->select_start != state->select_end) {
        stb_textedit_move_to_last(str,state);
        return;
      }
      iVar4 = STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(str,state->cursor);
      state->cursor = iVar4;
      stb_textedit_clamp(str,state);
      return;
    }
    if (uStack_1c != 0x20000e) {
      if (uStack_1c != 0x20000f) {
        if (uStack_1c == 0x600000) {
          stb_textedit_clamp(str,state);
          stb_textedit_prep_selection_at_cursor(state);
          if (0 < state->select_end) {
            state->select_end = state->select_end + -1;
          }
          state->cursor = state->select_end;
          state->has_preferred_x = '\0';
          return;
        }
        if (uStack_1c == 0x600001) {
          stb_textedit_prep_selection_at_cursor(state);
          state->select_end = state->select_end + 1;
          stb_textedit_clamp(str,state);
          state->cursor = state->select_end;
          state->has_preferred_x = '\0';
          return;
        }
        if (uStack_1c == 0x600002) goto LAB_0018c3cb;
        if (uStack_1c != 0x600003) {
          if (uStack_1c == 0x600004) {
            stb_textedit_clamp(str,state);
            stb_textedit_prep_selection_at_cursor(state);
            if (state->single_line == '\0') {
              while( true ) {
                bVar1 = false;
                if (0 < state->cursor) {
                  IVar2 = STB_TEXTEDIT_GETCHAR(str,state->cursor + -1);
                  bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
                }
                if (!bVar1) break;
                state->cursor = state->cursor + -1;
              }
            }
            else {
              state->cursor = 0;
            }
            state->select_end = state->cursor;
            state->has_preferred_x = '\0';
            return;
          }
          if (uStack_1c == 0x600005) {
            iVar4 = STB_TEXTEDIT_STRINGLEN(str);
            stb_textedit_clamp(str,state);
            stb_textedit_prep_selection_at_cursor(state);
            if (state->single_line == '\0') {
              while( true ) {
                bVar1 = false;
                if (state->cursor < iVar4) {
                  IVar2 = STB_TEXTEDIT_GETCHAR(str,state->cursor);
                  bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
                }
                if (!bVar1) break;
                state->cursor = state->cursor + 1;
              }
            }
            else {
              state->cursor = iVar4;
            }
            state->select_end = state->cursor;
            state->has_preferred_x = '\0';
            return;
          }
          if (uStack_1c == 0x600006) {
            stb_textedit_prep_selection_at_cursor(state);
            state->select_end = 0;
            state->cursor = 0;
            state->has_preferred_x = '\0';
            return;
          }
          if (uStack_1c == 0x600007) {
            stb_textedit_prep_selection_at_cursor(state);
            iVar4 = STB_TEXTEDIT_STRINGLEN(str);
            state->select_end = iVar4;
            state->cursor = iVar4;
            state->has_preferred_x = '\0';
            return;
          }
          if (uStack_1c == 0x600008) goto LAB_0018c6bf;
          if (uStack_1c == 0x600009) goto LAB_0018c722;
          if (uStack_1c == 0x60000c) {
            if (state->select_start == state->select_end) {
              stb_textedit_prep_selection_at_cursor(state);
            }
            iVar4 = STB_TEXTEDIT_MOVEWORDLEFT_IMPL(str,state->cursor);
            state->cursor = iVar4;
            state->select_end = state->cursor;
            stb_textedit_clamp(str,state);
            return;
          }
          if (uStack_1c == 0x60000d) {
            if (state->select_start == state->select_end) {
              stb_textedit_prep_selection_at_cursor(state);
            }
            iVar4 = STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(str,state->cursor);
            state->cursor = iVar4;
            state->select_end = state->cursor;
            stb_textedit_clamp(str,state);
            return;
          }
          if (uStack_1c == 0x60000e) goto LAB_0018c3cb;
          if (uStack_1c != 0x60000f) {
            find.prev_first = STB_TEXTEDIT_KEYTOTEXT(uStack_1c);
            if (find.prev_first < 1) {
              return;
            }
            find.length._2_2_ = (undefined2)find.prev_first;
            if ((find.prev_first == 10) && (state->single_line != '\0')) {
              return;
            }
            if ((state->insert_mode != '\0') &&
               ((state->select_start == state->select_end &&
                (iVar4 = state->cursor, iVar3 = STB_TEXTEDIT_STRINGLEN(str), iVar4 < iVar3)))) {
              stb_text_makeundo_replace(str,state,state->cursor,1,1);
              STB_TEXTEDIT_DELETECHARS(str,state->cursor,1);
              bVar1 = STB_TEXTEDIT_INSERTCHARS
                                (str,state->cursor,(ImWchar *)((long)&find.length + 2),1);
              if (!bVar1) {
                return;
              }
              state->cursor = state->cursor + 1;
              state->has_preferred_x = '\0';
              return;
            }
            stb_textedit_delete_selection(str,state);
            bVar1 = STB_TEXTEDIT_INSERTCHARS
                              (str,state->cursor,(ImWchar *)((long)&find.length + 2),1);
            if (!bVar1) {
              return;
            }
            stb_text_makeundo_insert(state,state->cursor,1);
            state->cursor = state->cursor + 1;
            state->has_preferred_x = '\0';
            return;
          }
        }
      }
LAB_0018c189:
      bVar1 = (uStack_1c & 0x400000) != 0;
      if ((uStack_1c & 0xffbfffff) == 0x20000f) {
        local_e4 = state->row_count_per_page;
      }
      else {
        local_e4 = 1;
        if (state->single_line != '\0') {
          uStack_1c = uStack_1c & 0x400000 | 0x200001;
          goto LAB_0018bbb6;
        }
      }
      if (bVar1) {
        stb_textedit_prep_selection_at_cursor(state);
      }
      else if (state->select_start != state->select_end) {
        stb_textedit_move_to_last(str,state);
      }
      stb_textedit_clamp(str,state);
      stb_textedit_find_charpos
                ((StbFindState *)&row.ymax,str,state->cursor,(uint)state->single_line);
      is_page = 0;
      do {
        if (local_e4 <= is_page) {
          return;
        }
        if (state->has_preferred_x == '\0') {
          local_e8 = row.ymax;
        }
        else {
          local_e8 = state->preferred_x;
        }
        iVar4 = (int)find.y + (int)find.height;
        if (find.height == 0.0) {
          return;
        }
        IVar2 = STB_TEXTEDIT_GETCHAR(str,(int)find.y + (int)find.height + -1);
        if (IVar2 != STB_TEXTEDIT_NEWLINE) {
          return;
        }
        state->cursor = iVar4;
        STB_TEXTEDIT_LAYOUTROW((StbTexteditRow *)&j,str,state->cursor);
        start = j;
        for (sel = 0; sel < (int)row.ymin; sel = sel + 1) {
          fVar6 = STB_TEXTEDIT_GETWIDTH(str,iVar4,sel);
          if (((fVar6 == -1.0) && (!NAN(fVar6))) ||
             (start = (int)(fVar6 + (float)start), local_e8 < (float)start)) break;
          state->cursor = state->cursor + 1;
        }
        stb_textedit_clamp(str,state);
        state->has_preferred_x = '\x01';
        state->preferred_x = local_e8;
        if (bVar1) {
          state->select_end = state->cursor;
        }
        find.y = (float)((int)find.y + (int)find.height);
        find.height = row.ymin;
        is_page = is_page + 1;
      } while( true );
    }
LAB_0018c3cb:
    bVar1 = (uStack_1c & 0x400000) != 0;
    if ((uStack_1c & 0xffbfffff) == 0x20000e) {
      local_ec = state->row_count_per_page;
LAB_0018c458:
      if (bVar1) {
        stb_textedit_prep_selection_at_cursor(state);
      }
      else if (state->select_start != state->select_end) {
        stb_textedit_move_to_first(state);
      }
      stb_textedit_clamp(str,state);
      stb_textedit_find_charpos
                ((StbFindState *)&row_1.ymax,str,state->cursor,(uint)state->single_line);
      sel_1 = 0;
      do {
        if (local_ec <= sel_1) {
          return;
        }
        if (state->has_preferred_x == '\0') {
          local_f0 = row_1.ymax;
        }
        else {
          local_f0 = state->preferred_x;
        }
        if ((float)find_1.first_char == find_1.y) {
          return;
        }
        state->cursor = find_1.first_char;
        STB_TEXTEDIT_LAYOUTROW((StbTexteditRow *)&j_1,str,state->cursor);
        dx_1 = (float)j_1;
        for (prev_scan = 0; prev_scan < (int)row_1.ymin; prev_scan = prev_scan + 1) {
          fVar6 = STB_TEXTEDIT_GETWIDTH(str,find_1.first_char,prev_scan);
          if (((fVar6 == -1.0) && (!NAN(fVar6))) || (dx_1 = fVar6 + dx_1, local_f0 < dx_1)) break;
          state->cursor = state->cursor + 1;
        }
        stb_textedit_clamp(str,state);
        state->has_preferred_x = '\x01';
        state->preferred_x = local_f0;
        if (bVar1) {
          state->select_end = state->cursor;
        }
        if (find_1.first_char < 1) {
          local_f4 = 0;
        }
        else {
          local_f4 = find_1.first_char + -1;
        }
        is_page_1 = local_f4;
        while( true ) {
          bVar5 = false;
          if (0 < is_page_1) {
            IVar2 = STB_TEXTEDIT_GETCHAR(str,is_page_1 + -1);
            bVar5 = IVar2 != STB_TEXTEDIT_NEWLINE;
          }
          if (!bVar5) break;
          is_page_1 = is_page_1 + -1;
        }
        find_1.y = (float)find_1.first_char;
        find_1.first_char = is_page_1;
        sel_1 = sel_1 + 1;
      } while( true );
    }
    local_ec = 1;
    if (state->single_line == '\0') goto LAB_0018c458;
    uStack_1c = uStack_1c & 0x400000 | 0x200000;
  } while( true );
}

Assistant:

static void stb_textedit_key(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_KEYTYPE key)
{
retry:
   switch (key) {
      default: {
         int c = STB_TEXTEDIT_KEYTOTEXT(key);
         if (c > 0) {
            STB_TEXTEDIT_CHARTYPE ch = (STB_TEXTEDIT_CHARTYPE) c;

            // can't add newline in single-line mode
            if (c == '\n' && state->single_line)
               break;

            if (state->insert_mode && !STB_TEXT_HAS_SELECTION(state) && state->cursor < STB_TEXTEDIT_STRINGLEN(str)) {
               stb_text_makeundo_replace(str, state, state->cursor, 1, 1);
               STB_TEXTEDIT_DELETECHARS(str, state->cursor, 1);
               if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, &ch, 1)) {
                  ++state->cursor;
                  state->has_preferred_x = 0;
               }
            } else {
               stb_textedit_delete_selection(str,state); // implicitly clamps
               if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, &ch, 1)) {
                  stb_text_makeundo_insert(state, state->cursor, 1);
                  ++state->cursor;
                  state->has_preferred_x = 0;
               }
            }
         }
         break;
      }

#ifdef STB_TEXTEDIT_K_INSERT
      case STB_TEXTEDIT_K_INSERT:
         state->insert_mode = !state->insert_mode;
         break;
#endif
         
      case STB_TEXTEDIT_K_UNDO:
         stb_text_undo(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_REDO:
         stb_text_redo(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_LEFT:
         // if currently there's a selection, move cursor to start of selection
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);
         else 
            if (state->cursor > 0)
               --state->cursor;
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_RIGHT:
         // if currently there's a selection, move cursor to end of selection
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_last(str, state);
         else
            ++state->cursor;
         stb_textedit_clamp(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_LEFT | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         // move selection left
         if (state->select_end > 0)
            --state->select_end;
         state->cursor = state->select_end;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_MOVEWORDLEFT
      case STB_TEXTEDIT_K_WORDLEFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);
         else {
            state->cursor = STB_TEXTEDIT_MOVEWORDLEFT(str, state->cursor);
            stb_textedit_clamp( str, state );
         }
         break;

      case STB_TEXTEDIT_K_WORDLEFT | STB_TEXTEDIT_K_SHIFT:
         if( !STB_TEXT_HAS_SELECTION( state ) )
            stb_textedit_prep_selection_at_cursor(state);

         state->cursor = STB_TEXTEDIT_MOVEWORDLEFT(str, state->cursor);
         state->select_end = state->cursor;

         stb_textedit_clamp( str, state );
         break;
#endif

#ifdef STB_TEXTEDIT_MOVEWORDRIGHT
      case STB_TEXTEDIT_K_WORDRIGHT:
         if (STB_TEXT_HAS_SELECTION(state)) 
            stb_textedit_move_to_last(str, state);
         else {
            state->cursor = STB_TEXTEDIT_MOVEWORDRIGHT(str, state->cursor);
            stb_textedit_clamp( str, state );
         }
         break;

      case STB_TEXTEDIT_K_WORDRIGHT | STB_TEXTEDIT_K_SHIFT:
         if( !STB_TEXT_HAS_SELECTION( state ) )
            stb_textedit_prep_selection_at_cursor(state);

         state->cursor = STB_TEXTEDIT_MOVEWORDRIGHT(str, state->cursor);
         state->select_end = state->cursor;

         stb_textedit_clamp( str, state );
         break;
#endif

      case STB_TEXTEDIT_K_RIGHT | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         // move selection right
         ++state->select_end;
         stb_textedit_clamp(str, state);
         state->cursor = state->select_end;
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_DOWN:
      case STB_TEXTEDIT_K_DOWN | STB_TEXTEDIT_K_SHIFT:
      case STB_TEXTEDIT_K_PGDOWN:
      case STB_TEXTEDIT_K_PGDOWN | STB_TEXTEDIT_K_SHIFT: {
         StbFindState find;
         StbTexteditRow row;
         int i, j, sel = (key & STB_TEXTEDIT_K_SHIFT) != 0;
         int is_page = (key & ~STB_TEXTEDIT_K_SHIFT) == STB_TEXTEDIT_K_PGDOWN;
         int row_count = is_page ? state->row_count_per_page : 1;

         if (!is_page && state->single_line) {
            // on windows, up&down in single-line behave like left&right
            key = STB_TEXTEDIT_K_RIGHT | (key & STB_TEXTEDIT_K_SHIFT);
            goto retry;
         }

         if (sel)
            stb_textedit_prep_selection_at_cursor(state);
         else if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_last(str, state);

         // compute current position of cursor point
         stb_textedit_clamp(str, state);
         stb_textedit_find_charpos(&find, str, state->cursor, state->single_line);

         for (j = 0; j < row_count; ++j) {
            float x, goal_x = state->has_preferred_x ? state->preferred_x : find.x;
            int start = find.first_char + find.length;

            if (find.length == 0)
               break;

            // [DEAR IMGUI]
            // going down while being on the last line shouldn't bring us to that line end
            if (STB_TEXTEDIT_GETCHAR(str, find.first_char + find.length - 1) != STB_TEXTEDIT_NEWLINE)
               break;

            // now find character position down a row
            state->cursor = start;
            STB_TEXTEDIT_LAYOUTROW(&row, str, state->cursor);
            x = row.x0;
            for (i=0; i < row.num_chars; ++i) {
               float dx = STB_TEXTEDIT_GETWIDTH(str, start, i);
               #ifdef STB_TEXTEDIT_GETWIDTH_NEWLINE
               if (dx == STB_TEXTEDIT_GETWIDTH_NEWLINE)
                  break;
               #endif
               x += dx;
               if (x > goal_x)
                  break;
               ++state->cursor;
            }
            stb_textedit_clamp(str, state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;

            if (sel)
               state->select_end = state->cursor;

            // go to next line
            find.first_char = find.first_char + find.length;
            find.length = row.num_chars;
         }
         break;
      }
         
      case STB_TEXTEDIT_K_UP:
      case STB_TEXTEDIT_K_UP | STB_TEXTEDIT_K_SHIFT:
      case STB_TEXTEDIT_K_PGUP:
      case STB_TEXTEDIT_K_PGUP | STB_TEXTEDIT_K_SHIFT: {
         StbFindState find;
         StbTexteditRow row;
         int i, j, prev_scan, sel = (key & STB_TEXTEDIT_K_SHIFT) != 0;
         int is_page = (key & ~STB_TEXTEDIT_K_SHIFT) == STB_TEXTEDIT_K_PGUP;
         int row_count = is_page ? state->row_count_per_page : 1;

         if (!is_page && state->single_line) {
            // on windows, up&down become left&right
            key = STB_TEXTEDIT_K_LEFT | (key & STB_TEXTEDIT_K_SHIFT);
            goto retry;
         }

         if (sel)
            stb_textedit_prep_selection_at_cursor(state);
         else if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);

         // compute current position of cursor point
         stb_textedit_clamp(str, state);
         stb_textedit_find_charpos(&find, str, state->cursor, state->single_line);

         for (j = 0; j < row_count; ++j) {
            float  x, goal_x = state->has_preferred_x ? state->preferred_x : find.x;

            // can only go up if there's a previous row
            if (find.prev_first == find.first_char)
               break;

            // now find character position up a row
            state->cursor = find.prev_first;
            STB_TEXTEDIT_LAYOUTROW(&row, str, state->cursor);
            x = row.x0;
            for (i=0; i < row.num_chars; ++i) {
               float dx = STB_TEXTEDIT_GETWIDTH(str, find.prev_first, i);
               #ifdef STB_TEXTEDIT_GETWIDTH_NEWLINE
               if (dx == STB_TEXTEDIT_GETWIDTH_NEWLINE)
                  break;
               #endif
               x += dx;
               if (x > goal_x)
                  break;
               ++state->cursor;
            }
            stb_textedit_clamp(str, state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;

            if (sel)
               state->select_end = state->cursor;

            // go to previous line
            // (we need to scan previous line the hard way. maybe we could expose this as a new API function?)
            prev_scan = find.prev_first > 0 ? find.prev_first - 1 : 0;
            while (prev_scan > 0 && STB_TEXTEDIT_GETCHAR(str, prev_scan - 1) != STB_TEXTEDIT_NEWLINE)
               --prev_scan;
            find.first_char = find.prev_first;
            find.prev_first = prev_scan;
         }
         break;
      }

      case STB_TEXTEDIT_K_DELETE:
      case STB_TEXTEDIT_K_DELETE | STB_TEXTEDIT_K_SHIFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_delete_selection(str, state);
         else {
            int n = STB_TEXTEDIT_STRINGLEN(str);
            if (state->cursor < n)
               stb_textedit_delete(str, state, state->cursor, 1);
         }
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_BACKSPACE:
      case STB_TEXTEDIT_K_BACKSPACE | STB_TEXTEDIT_K_SHIFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_delete_selection(str, state);
         else {
            stb_textedit_clamp(str, state);
            if (state->cursor > 0) {
               stb_textedit_delete(str, state, state->cursor-1, 1);
               --state->cursor;
            }
         }
         state->has_preferred_x = 0;
         break;
         
#ifdef STB_TEXTEDIT_K_TEXTSTART2
      case STB_TEXTEDIT_K_TEXTSTART2:
#endif
      case STB_TEXTEDIT_K_TEXTSTART:
         state->cursor = state->select_start = state->select_end = 0;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_TEXTEND2
      case STB_TEXTEDIT_K_TEXTEND2:
#endif
      case STB_TEXTEDIT_K_TEXTEND:
         state->cursor = STB_TEXTEDIT_STRINGLEN(str);
         state->select_start = state->select_end = 0;
         state->has_preferred_x = 0;
         break;
        
#ifdef STB_TEXTEDIT_K_TEXTSTART2
      case STB_TEXTEDIT_K_TEXTSTART2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_TEXTSTART | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         state->cursor = state->select_end = 0;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_TEXTEND2
      case STB_TEXTEDIT_K_TEXTEND2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_TEXTEND | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         state->cursor = state->select_end = STB_TEXTEDIT_STRINGLEN(str);
         state->has_preferred_x = 0;
         break;


#ifdef STB_TEXTEDIT_K_LINESTART2
      case STB_TEXTEDIT_K_LINESTART2:
#endif
      case STB_TEXTEDIT_K_LINESTART:
         stb_textedit_clamp(str, state);
         stb_textedit_move_to_first(state);
         if (state->single_line)
            state->cursor = 0;
         else while (state->cursor > 0 && STB_TEXTEDIT_GETCHAR(str, state->cursor-1) != STB_TEXTEDIT_NEWLINE)
            --state->cursor;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_LINEEND2
      case STB_TEXTEDIT_K_LINEEND2:
#endif
      case STB_TEXTEDIT_K_LINEEND: {
         int n = STB_TEXTEDIT_STRINGLEN(str);
         stb_textedit_clamp(str, state);
         stb_textedit_move_to_first(state);
         if (state->single_line)
             state->cursor = n;
         else while (state->cursor < n && STB_TEXTEDIT_GETCHAR(str, state->cursor) != STB_TEXTEDIT_NEWLINE)
             ++state->cursor;
         state->has_preferred_x = 0;
         break;
      }

#ifdef STB_TEXTEDIT_K_LINESTART2
      case STB_TEXTEDIT_K_LINESTART2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_LINESTART | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         if (state->single_line)
            state->cursor = 0;
         else while (state->cursor > 0 && STB_TEXTEDIT_GETCHAR(str, state->cursor-1) != STB_TEXTEDIT_NEWLINE)
            --state->cursor;
         state->select_end = state->cursor;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_LINEEND2
      case STB_TEXTEDIT_K_LINEEND2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_LINEEND | STB_TEXTEDIT_K_SHIFT: {
         int n = STB_TEXTEDIT_STRINGLEN(str);
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         if (state->single_line)
             state->cursor = n;
         else while (state->cursor < n && STB_TEXTEDIT_GETCHAR(str, state->cursor) != STB_TEXTEDIT_NEWLINE)
            ++state->cursor;
         state->select_end = state->cursor;
         state->has_preferred_x = 0;
         break;
      }
   }
}